

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O3

void Pf_StoPrint(Pf_Man_t *p,int fVerbose)

{
  Vec_Int_t *pVVar1;
  Vec_Wec_t *pVVar2;
  int iVar3;
  uint uVar4;
  int i;
  long lVar5;
  ulong uVar6;
  
  pVVar2 = p->vTt2Match;
  uVar4 = 0;
  if (2 < pVVar2->nSize) {
    uVar4 = 0;
    uVar6 = 2;
    do {
      pVVar1 = pVVar2->pArray;
      iVar3 = pVVar1[uVar6].nSize;
      if (1 < iVar3) {
        lVar5 = 1;
        i = 0;
        do {
          if (uVar6 < 10 && fVerbose != 0) {
            Pf_StoPrintOne(p,uVar4 + i + 1,(int)uVar6,i,pVVar1[uVar6].pArray[lVar5 + -1],
                           *(Pf_Mat_t *)(pVVar1[uVar6].pArray + lVar5));
            iVar3 = pVVar1[uVar6].nSize;
          }
          lVar5 = lVar5 + 2;
          i = i + 1;
        } while ((int)lVar5 < iVar3);
        pVVar2 = p->vTt2Match;
        uVar4 = uVar4 + i;
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)pVVar2->nSize);
  }
  printf("Gates = %d.  Truths = %d.  Matches = %d.\n",(ulong)(uint)p->nCells,
         (ulong)(uint)p->vTtMem->nEntries,(ulong)uVar4);
  return;
}

Assistant:

void Pf_StoPrint( Pf_Man_t * p, int fVerbose )
{
    int t, i, GateId, Entry, Count = 0;
    for ( t = 2; t < Vec_WecSize(p->vTt2Match); t++ )
    {
        Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, t );
        Vec_IntForEachEntryDouble( vArr, GateId, Entry, i )
        {
            Count++;
            if ( !fVerbose )
                continue;
            if ( t < 10 )
                Pf_StoPrintOne( p, Count, t, i/2, GateId, Pf_Int2Mat(Entry) );
        }
    }
    printf( "Gates = %d.  Truths = %d.  Matches = %d.\n", 
        p->nCells, Vec_MemEntryNum(p->vTtMem), Count );
}